

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

size_t __thiscall caffe::SolverParameter::ByteSizeLong(SolverParameter *this)

{
  byte bVar1;
  void *pvVar2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  Type *pTVar6;
  size_t sVar7;
  Type *this_00;
  Type *this_01;
  size_t sVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  uint uVar12;
  int n;
  long lVar13;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar7 = 0;
  }
  else {
    sVar7 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar9 = (this->test_net_).super_RepeatedPtrFieldBase.current_size_;
  lVar13 = sVar7 + uVar9;
  if (0 < (int)uVar9) {
    uVar12 = 0;
    do {
      pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->test_net_).super_RepeatedPtrFieldBase,uVar12);
      uVar5 = (uint)pTVar6->_M_string_length | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      lVar13 = lVar13 + pTVar6->_M_string_length + (ulong)(iVar4 * 9 + 0x49U >> 6);
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  sVar7 = google::protobuf::internal::WireFormatLite::Int32Size(&this->test_iter_);
  uVar9 = (this->test_net_param_).super_RepeatedPtrFieldBase.current_size_;
  lVar13 = (uint)(this->test_iter_).current_size_ + sVar7 + lVar13 + (ulong)uVar9 * 2;
  if ((ulong)uVar9 != 0) {
    uVar12 = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetParameter>::TypeHandler>
                          (&(this->test_net_param_).super_RepeatedPtrFieldBase,uVar12);
      sVar7 = NetParameter::ByteSizeLong(this_00);
      uVar5 = (uint)sVar7 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      lVar13 = lVar13 + sVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  uVar9 = (this->test_state_).super_RepeatedPtrFieldBase.current_size_;
  lVar13 = lVar13 + (ulong)uVar9 * 2;
  if ((ulong)uVar9 != 0) {
    uVar12 = 0;
    do {
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
                          (&(this->test_state_).super_RepeatedPtrFieldBase,uVar12);
      sVar7 = NetState::ByteSizeLong(this_01);
      uVar5 = (uint)sVar7 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      lVar13 = lVar13 + sVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  sVar7 = google::protobuf::internal::WireFormatLite::Int32Size(&this->stepvalue_);
  sVar7 = sVar7 + lVar13 + (ulong)(uint)(this->stepvalue_).current_size_ * 2;
  bVar1 = (byte)(this->_has_bits_).has_bits_[0];
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      sVar3 = ((this->train_net_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 2) != 0) {
      sVar3 = ((this->lr_policy_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 4) != 0) {
      sVar3 = ((this->snapshot_prefix_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((bVar1 & 8) != 0) {
      sVar3 = ((this->net_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
    }
    if ((bVar1 & 0x10) != 0) {
      sVar3 = ((this->regularization_type_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
    }
    if ((bVar1 & 0x20) != 0) {
      sVar3 = ((this->type_).ptr_)->_M_string_length;
      uVar9 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
    }
    if ((bVar1 & 0x40) != 0) {
      sVar8 = NetParameter::ByteSizeLong(this->train_net_param_);
      uVar9 = (uint)sVar8 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + sVar8 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
    }
    if (((this->_has_bits_).has_bits_[0] & 0x80) != 0) {
      sVar8 = NetParameter::ByteSizeLong(this->net_param_);
      uVar9 = (uint)sVar8 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + sVar8 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
    }
  }
  uVar9 = (this->_has_bits_).has_bits_[0];
  if ((uVar9 & 0xff00) != 0) {
    if ((uVar9 >> 8 & 1) != 0) {
      sVar8 = NetState::ByteSizeLong(this->train_state_);
      uVar9 = (uint)sVar8 | 1;
      iVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar7 = sVar7 + sVar8 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
    }
    uVar9 = (this->_has_bits_).has_bits_[0];
    if ((uVar9 >> 9 & 1) != 0) {
      if (this->test_interval_ < 0) {
        uVar11 = 0xb;
      }
      else {
        uVar12 = this->test_interval_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar7 = sVar7 + uVar11;
    }
    sVar8 = sVar7 + 5;
    if ((uVar9 >> 10 & 1) == 0) {
      sVar8 = sVar7;
    }
    if ((uVar9 >> 0xb & 1) != 0) {
      if (this->display_ < 0) {
        uVar11 = 0xb;
      }
      else {
        uVar12 = this->display_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar11;
    }
    if ((uVar9 >> 0xc & 1) != 0) {
      if (this->max_iter_ < 0) {
        uVar11 = 0xb;
      }
      else {
        uVar12 = this->max_iter_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar11;
    }
    sVar7 = sVar8 + 5;
    if ((uVar9 >> 0xd & 1) == 0) {
      sVar7 = sVar8;
    }
    sVar8 = sVar7 + 5;
    if ((uVar9 >> 0xe & 1) == 0) {
      sVar8 = sVar7;
    }
    sVar7 = sVar8 + 5;
    if (-1 < (short)uVar9) {
      sVar7 = sVar8;
    }
  }
  uVar9 = (this->_has_bits_).has_bits_[0];
  if ((uVar9 & 0xff0000) != 0) {
    sVar8 = sVar7 + 5;
    if ((uVar9 >> 0x10 & 1) == 0) {
      sVar8 = sVar7;
    }
    if ((uVar9 >> 0x11 & 1) != 0) {
      if (this->stepsize_ < 0) {
        uVar11 = 0xb;
      }
      else {
        uVar12 = this->stepsize_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar11;
    }
    if ((uVar9 >> 0x12 & 1) != 0) {
      if (this->snapshot_ < 0) {
        uVar11 = 0xb;
      }
      else {
        uVar12 = this->snapshot_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 1);
      }
      sVar8 = sVar8 + uVar11;
    }
    if ((uVar9 >> 0x13 & 1) != 0) {
      if (this->device_id_ < 0) {
        uVar11 = 0xc;
      }
      else {
        uVar12 = this->device_id_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 2);
      }
      sVar8 = sVar8 + uVar11;
    }
    sVar7 = sVar8 + 3;
    if ((uVar9 >> 0x14 & 1) == 0) {
      sVar7 = sVar8;
    }
    sVar8 = sVar7 + 3;
    if ((uVar9 >> 0x15 & 1) == 0) {
      sVar8 = sVar7;
    }
    sVar7 = sVar8 + 3;
    if ((uVar9 >> 0x16 & 1) == 0) {
      sVar7 = sVar8;
    }
    if ((uVar9 >> 0x17 & 1) != 0) {
      if (this->solver_type_ < 0) {
        uVar11 = 0xc;
      }
      else {
        uVar12 = this->solver_type_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 2);
      }
      sVar7 = sVar7 + uVar11;
    }
  }
  if (0xffffff < uVar9) {
    sVar8 = sVar7 + 6;
    if ((uVar9 >> 0x18 & 1) == 0) {
      sVar8 = sVar7;
    }
    if ((uVar9 >> 0x19 & 1) != 0) {
      uVar11 = this->random_seed_ | 1;
      lVar13 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      sVar8 = sVar8 + ((int)lVar13 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar9 >> 0x1a & 1) != 0) {
      if (this->solver_mode_ < 0) {
        uVar11 = 0xc;
      }
      else {
        uVar12 = this->solver_mode_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 2);
      }
      sVar8 = sVar8 + uVar11;
    }
    sVar7 = sVar8 + 3;
    if ((uVar9 >> 0x1b & 1) == 0) {
      sVar7 = sVar8;
    }
    sVar8 = sVar7 + 3;
    if ((uVar9 >> 0x1c & 1) == 0) {
      sVar8 = sVar7;
    }
    sVar10 = sVar8 + 6;
    if ((uVar9 >> 0x1d & 1) == 0) {
      sVar10 = sVar8;
    }
    if ((uVar9 >> 0x1e & 1) != 0) {
      if (this->average_loss_ < 0) {
        uVar11 = 0xc;
      }
      else {
        uVar12 = this->average_loss_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 2);
      }
      sVar10 = sVar10 + uVar11;
    }
    sVar7 = sVar10 + 6;
    if (-1 < (int)uVar9) {
      sVar7 = sVar10;
    }
  }
  if (((this->_has_bits_).has_bits_[1] & 7) != 0) {
    uVar9 = (this->_has_bits_).has_bits_[1];
    if ((uVar9 & 1) != 0) {
      if (this->iter_size_ < 0) {
        uVar11 = 0xc;
      }
      else {
        uVar12 = this->iter_size_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 2);
      }
      sVar7 = sVar7 + uVar11;
    }
    if ((uVar9 & 2) != 0) {
      if (this->snapshot_format_ < 0) {
        uVar11 = 0xc;
      }
      else {
        uVar12 = this->snapshot_format_ | 1;
        iVar4 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar11 = (ulong)((iVar4 * 9 + 0x49U >> 6) + 2);
      }
      sVar7 = sVar7 + uVar11;
    }
    if ((uVar9 & 4) != 0) {
      sVar7 = sVar7 + 6;
    }
  }
  this->_cached_size_ = (int)sVar7;
  return sVar7;
}

Assistant:

size_t SolverParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.SolverParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated string test_net = 2;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->test_net_size());
  for (int i = 0, n = this->test_net_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->test_net(i));
  }

  // repeated int32 test_iter = 3;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->test_iter_);
    total_size += 1 *
                  ::google::protobuf::internal::FromIntSize(this->test_iter_size());
    total_size += data_size;
  }

  // repeated .caffe.NetParameter test_net_param = 22;
  {
    unsigned int count = this->test_net_param_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->test_net_param(i));
    }
  }

  // repeated .caffe.NetState test_state = 27;
  {
    unsigned int count = this->test_state_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->test_state(i));
    }
  }

  // repeated int32 stepvalue = 34;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->stepvalue_);
    total_size += 2 *
                  ::google::protobuf::internal::FromIntSize(this->stepvalue_size());
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 255u) {
    // optional string train_net = 1;
    if (has_train_net()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->train_net());
    }

    // optional string lr_policy = 8;
    if (has_lr_policy()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->lr_policy());
    }

    // optional string snapshot_prefix = 15;
    if (has_snapshot_prefix()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->snapshot_prefix());
    }

    // optional string net = 24;
    if (has_net()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->net());
    }

    // optional string regularization_type = 29 [default = "L2"];
    if (has_regularization_type()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->regularization_type());
    }

    // optional string type = 40 [default = "SGD"];
    if (has_type()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type());
    }

    // optional .caffe.NetParameter train_net_param = 21;
    if (has_train_net_param()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->train_net_param_);
    }

    // optional .caffe.NetParameter net_param = 25;
    if (has_net_param()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->net_param_);
    }

  }
  if (_has_bits_[8 / 32] & 65280u) {
    // optional .caffe.NetState train_state = 26;
    if (has_train_state()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->train_state_);
    }

    // optional int32 test_interval = 4 [default = 0];
    if (has_test_interval()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->test_interval());
    }

    // optional float base_lr = 5;
    if (has_base_lr()) {
      total_size += 1 + 4;
    }

    // optional int32 display = 6;
    if (has_display()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->display());
    }

    // optional int32 max_iter = 7;
    if (has_max_iter()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->max_iter());
    }

    // optional float gamma = 9;
    if (has_gamma()) {
      total_size += 1 + 4;
    }

    // optional float power = 10;
    if (has_power()) {
      total_size += 1 + 4;
    }

    // optional float momentum = 11;
    if (has_momentum()) {
      total_size += 1 + 4;
    }

  }
  if (_has_bits_[16 / 32] & 16711680u) {
    // optional float weight_decay = 12;
    if (has_weight_decay()) {
      total_size += 1 + 4;
    }

    // optional int32 stepsize = 13;
    if (has_stepsize()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->stepsize());
    }

    // optional int32 snapshot = 14 [default = 0];
    if (has_snapshot()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->snapshot());
    }

    // optional int32 device_id = 18 [default = 0];
    if (has_device_id()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->device_id());
    }

    // optional bool test_compute_loss = 19 [default = false];
    if (has_test_compute_loss()) {
      total_size += 2 + 1;
    }

    // optional bool snapshot_diff = 16 [default = false];
    if (has_snapshot_diff()) {
      total_size += 2 + 1;
    }

    // optional bool debug_info = 23 [default = false];
    if (has_debug_info()) {
      total_size += 2 + 1;
    }

    // optional .caffe.SolverParameter.SolverType solver_type = 30 [default = SGD];
    if (has_solver_type()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->solver_type());
    }

  }
  if (_has_bits_[24 / 32] & 4278190080u) {
    // optional float momentum2 = 39 [default = 0.999];
    if (has_momentum2()) {
      total_size += 2 + 4;
    }

    // optional int64 random_seed = 20 [default = -1];
    if (has_random_seed()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->random_seed());
    }

    // optional .caffe.SolverParameter.SolverMode solver_mode = 17 [default = GPU];
    if (has_solver_mode()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->solver_mode());
    }

    // optional bool test_initialization = 32 [default = true];
    if (has_test_initialization()) {
      total_size += 2 + 1;
    }

    // optional bool snapshot_after_train = 28 [default = true];
    if (has_snapshot_after_train()) {
      total_size += 2 + 1;
    }

    // optional float delta = 31 [default = 1e-08];
    if (has_delta()) {
      total_size += 2 + 4;
    }

    // optional int32 average_loss = 33 [default = 1];
    if (has_average_loss()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->average_loss());
    }

    // optional float clip_gradients = 35 [default = -1];
    if (has_clip_gradients()) {
      total_size += 2 + 4;
    }

  }
  if (_has_bits_[32 / 32] & 7u) {
    // optional int32 iter_size = 36 [default = 1];
    if (has_iter_size()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->iter_size());
    }

    // optional .caffe.SolverParameter.SnapshotFormat snapshot_format = 37 [default = BINARYPROTO];
    if (has_snapshot_format()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->snapshot_format());
    }

    // optional float rms_decay = 38 [default = 0.99];
    if (has_rms_decay()) {
      total_size += 2 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}